

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

ssize_t __thiscall r_code::SysView::read(SysView *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  uint uVar2;
  iterator __position;
  iterator __position_00;
  ulong in_RAX;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong uVar3;
  ulong uVar4;
  undefined4 in_register_00000034;
  uint *puVar5;
  Atom local_40;
  uint local_3c;
  vector<r_code::Atom,std::allocator<r_code::Atom>> *local_38;
  
  puVar5 = (uint *)CONCAT44(in_register_00000034,__fd);
  uVar1 = *puVar5;
  uVar2 = puVar5[1];
  if ((ulong)uVar1 == 0) {
    uVar3 = 0;
  }
  else {
    local_38 = (vector<r_code::Atom,std::allocator<r_code::Atom>> *)&(this->super_ImageObject).code;
    uVar3 = 0;
    do {
      Atom::Atom(&local_40,puVar5[uVar3 + 2]);
      __position._M_current =
           (this->super_ImageObject).code.m_vector.
           super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->super_ImageObject).code.m_vector.
          super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<r_code::Atom,std::allocator<r_code::Atom>>::
        _M_realloc_insert<r_code::Atom_const&>(local_38,__position,&local_40);
      }
      else {
        (__position._M_current)->atom = local_40.atom;
        (this->super_ImageObject).code.m_vector.
        super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      Atom::~Atom(&local_40);
      uVar3 = uVar3 + 1;
      in_RAX = extraout_RAX;
    } while (uVar1 != uVar3);
  }
  if ((ulong)uVar2 != 0) {
    uVar4 = 0;
    do {
      local_3c = puVar5[uVar3 + uVar4 + 2];
      in_RAX = (ulong)local_3c;
      __position_00._M_current =
           (this->super_ImageObject).references.m_vector.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->super_ImageObject).references.m_vector.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                   &(this->super_ImageObject).references,__position_00,&local_3c);
        in_RAX = extraout_RAX_00;
      }
      else {
        *__position_00._M_current = local_3c;
        (this->super_ImageObject).references.m_vector.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position_00._M_current + 1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  return in_RAX;
}

Assistant:

void SysView::read(uint32_t *data)
{
    size_t code_size = data[0];
    size_t reference_set_size = data[1];
    size_t i;
    size_t j;

    for (i = 0; i < code_size; ++i) {
        code.push_back(Atom(data[2 + i]));
    }

    for (j = 0; j < reference_set_size; ++j) {
        references.push_back(data[2 + i + j]);
    }
}